

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O2

size_t bpkiShareEnc(octet *pki,octet *share,size_t share_len)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  octet *poVar7;
  char *oid;
  octet *poVar8;
  der_anchor_t BelsAlgId [1];
  der_anchor_t PKI [1];
  
  sVar1 = derTSEQEncStart(PKI,pki,0,0x30);
  poVar7 = pki + sVar1;
  if (pki == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar2 = derTSIZEEnc(poVar7,2,0);
  poVar8 = poVar7 + sVar2;
  if (poVar7 == (octet *)0x0) {
    poVar8 = (octet *)0x0;
  }
  sVar3 = derTSEQEncStart(BelsAlgId,poVar8,sVar2 + sVar1,0x30);
  poVar7 = poVar8 + sVar3;
  if (poVar8 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar4 = derOIDEnc(poVar7,"1.2.112.0.2.0.34.101.60.11");
  poVar8 = poVar7 + sVar4;
  if (poVar7 == (octet *)0x0) {
    poVar8 = (octet *)0x0;
  }
  pcVar6 = "1.2.112.0.2.0.34.101.60.2.3";
  if (share_len == 0x19) {
    pcVar6 = "1.2.112.0.2.0.34.101.60.2.2";
  }
  oid = "1.2.112.0.2.0.34.101.60.2.1";
  if (share_len != 0x11) {
    oid = pcVar6;
  }
  sVar5 = derOIDEnc(poVar8,oid);
  poVar7 = poVar8 + sVar5;
  if (poVar8 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar5 = sVar5 + sVar2 + sVar1 + sVar3 + sVar4;
  sVar1 = derTSEQEncStop(poVar7,sVar5,BelsAlgId);
  poVar8 = poVar7 + sVar1;
  if (poVar7 == (octet *)0x0) {
    poVar8 = (octet *)0x0;
  }
  sVar2 = derEnc(poVar8,4,share,share_len);
  poVar7 = poVar8 + sVar2;
  if (poVar8 == (octet *)0x0) {
    poVar7 = (octet *)0x0;
  }
  sVar2 = sVar2 + sVar1 + sVar5;
  sVar1 = derTSEQEncStop(poVar7,sVar2,PKI);
  return sVar1 + sVar2;
}

Assistant:

static size_t bpkiShareEnc(octet pki[], const octet share[], size_t share_len)
{
	der_anchor_t PKI[1];
	der_anchor_t BelsAlgId[1];
	size_t count = 0;
	// проверить ключи
	ASSERT(share_len == 17 || share_len == 25 || share_len == 33);
	ASSERT(memIsNullOrValid(share, share_len));
	ASSERT(!share || 1 <= share[0] && share[0] <= 16);
	// кодировать
	derEncStep(derSEQEncStart(PKI, pki, count), pki, count);
	 derEncStep(derSIZEEnc(pki, 0), pki, count);
	 derEncStep(derSEQEncStart(BelsAlgId, pki, count), pki, count);
	  derEncStep(derOIDEnc(pki, oid_bels_share), pki, count);
	  if (share_len == 17)
		  derEncStep(derOIDEnc(pki, oid_bels_m0128v1), pki, count);
	  else if (share_len == 25)
		  derEncStep(derOIDEnc(pki, oid_bels_m0192v1), pki, count);
	  else
		  derEncStep(derOIDEnc(pki, oid_bels_m0256v1), pki, count);
	 derEncStep(derSEQEncStop(pki, count, BelsAlgId), pki, count);
	 derEncStep(derOCTEnc(pki, share, share_len), pki, count);
	derEncStep(derSEQEncStop(pki, count, PKI), pki, count);
	// возвратить длину DER-кода
	return count;
}